

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_7a9696::HandleReadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  _Ios_Seekdir _Var1;
  unsigned_long_long uVar2;
  const_reference name;
  cmExecutionStatus *this;
  bool bVar3;
  byte bVar4;
  int iVar5;
  size_type sVar6;
  cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *this_00;
  cmArgumentParser<Arguments> *pcVar7;
  cmMakefile *pcVar8;
  string *str;
  char *pcVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  static_string_view sVar13;
  bool local_5c9;
  bool local_5ac;
  bool local_529;
  undefined1 local_528 [7];
  bool has_newline;
  string line;
  string local_500 [3];
  char hex [4];
  char c;
  string output;
  longlong off;
  off_type offset;
  unsigned_long_long limit;
  size_type sizeLimit;
  string local_4b8;
  cmAlphaNum local_498;
  cmAlphaNum local_468;
  undefined1 local_438 [8];
  string error;
  ifstream file;
  cmAlphaNum local_210;
  cmAlphaNum local_1e0;
  string local_1b0;
  undefined1 local_190 [8];
  string fileName;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_160;
  undefined1 local_150 [8];
  Arguments arguments;
  cmArgumentParser<Arguments> local_d8;
  const_reference local_68;
  string *variable;
  string *fileNameArg;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar6 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"READ must be called with at least two additional arguments",
               &local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    variable = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
    local_68 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
    if (((anonymous_namespace)::
         HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::parser == '\0') &&
       (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser), iVar5 != 0)) {
      local_d8.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
      local_d8.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
      local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_d8.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
      local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object
           = (void *)0x0;
      local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
      local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_d8.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_d8.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cmArgumentParser<Arguments>::cmArgumentParser(&local_d8);
      sVar13 = ::cm::operator____s("OFFSET",6);
      this_00 = (cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                 *)cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                   ::Bind<std::__cxx11::string>
                             ((cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                               *)&local_d8,sVar13,0);
      sVar13 = ::cm::operator____s("LIMIT",5);
      pcVar7 = cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
               ::Bind<std::__cxx11::string>(this_00,sVar13,0x20);
      sVar13 = ::cm::operator____s("HEX",3);
      arguments._64_8_ = sVar13.super_string_view._M_len;
      pcVar7 = cmArgumentParser<Arguments>::Bind<bool>(pcVar7,sVar13,0x40);
      cmArgumentParser<Arguments>::cmArgumentParser(&HandleReadCommand::parser,pcVar7);
      cmArgumentParser<Arguments>::~cmArgumentParser(&local_d8);
      __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleReadCommand::parser,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
    join_0x00000010_0x00000000_ =
         cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
    local_160 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)((long)&fileName.field_2 + 8),3);
    cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Arguments *)local_150,
               (cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&HandleReadCommand::parser,&local_160,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0,0);
    std::__cxx11::string::string((string *)local_190,(string *)variable);
    bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_190);
    if (!bVar3) {
      pcVar8 = cmExecutionStatus::GetMakefile(local_20);
      str = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar8);
      cmAlphaNum::cmAlphaNum(&local_1e0,str);
      cmAlphaNum::cmAlphaNum(&local_210,'/');
      cmStrCat<std::__cxx11::string>(&local_1b0,&local_1e0,&local_210,variable);
      std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    pcVar9 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream((void *)((long)&error.field_2 + 8),pcVar9,_S_in);
    bVar4 = std::ios::operator!((ios *)((long)&error.field_2 +
                                       *(long *)(error.field_2._8_8_ + -0x18) + 8));
    if ((bVar4 & 1) == 0) {
      limit = 0xffffffffffffffff;
      uVar10 = std::__cxx11::string::empty();
      if (((uVar10 & 1) == 0) &&
         (bVar3 = cmStrToULongLong((string *)((long)&arguments.Offset.field_2 + 8),
                                   (unsigned_long_long *)&offset), bVar3)) {
        limit = offset;
      }
      off._0_4_ = _S_beg;
      _Var1 = (_Ios_Seekdir)off;
      off._0_4_ = _S_beg;
      uVar10 = std::__cxx11::string::empty();
      if (((uVar10 & 1) == 0) &&
         (bVar3 = cmStrToLongLong((string *)local_150,(longlong *)(output.field_2._M_local_buf + 8))
         , off._0_4_ = _Var1, bVar3)) {
        off._0_4_ = output.field_2._8_4_;
      }
      std::istream::seekg((long)((long)&error.field_2 + 8),(_Ios_Seekdir)off);
      std::__cxx11::string::string(local_500);
      if ((arguments.Limit.field_2._M_local_buf[8] & 1U) == 0) {
        std::__cxx11::string::string((string *)local_528);
        local_529 = false;
        while( true ) {
          local_5c9 = false;
          if (limit != 0) {
            local_5c9 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)(error.field_2._M_local_buf + 8),(string *)local_528,
                                   &local_529,limit);
          }
          uVar2 = limit;
          if (local_5c9 == false) break;
          lVar12 = std::__cxx11::string::size();
          limit = uVar2 - lVar12;
          if (((local_529 & 1U) != 0) && (limit != 0)) {
            limit = limit - 1;
          }
          std::__cxx11::string::operator+=(local_500,(string *)local_528);
          if ((local_529 & 1U) != 0) {
            std::__cxx11::string::operator+=(local_500,"\n");
          }
        }
        std::__cxx11::string::~string((string *)local_528);
      }
      else {
        while( true ) {
          local_5ac = false;
          if (limit != 0) {
            plVar11 = (long *)std::istream::get(error.field_2._M_local_buf + 8);
            local_5ac = std::ios::operator_cast_to_bool
                                  ((ios *)((long)plVar11 + *(long *)(*plVar11 + -0x18)));
          }
          if (local_5ac == false) break;
          snprintf(line.field_2._M_local_buf + 0xb,4,"%.2x",
                   (ulong)(byte)line.field_2._M_local_buf[0xf]);
          std::__cxx11::string::operator+=(local_500,line.field_2._M_local_buf + 0xb);
          limit = limit - 1;
        }
      }
      pcVar8 = cmExecutionStatus::GetMakefile(local_20);
      name = local_68;
      value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_500);
      cmMakefile::AddDefinition(pcVar8,name,value);
      args_local._7_1_ = 1;
      sizeLimit._4_4_ = 1;
      std::__cxx11::string::~string(local_500);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_468,"failed to open for reading (");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      cmAlphaNum::cmAlphaNum(&local_498,&local_4b8);
      cmStrCat<char[6],std::__cxx11::string>
                ((string *)local_438,&local_468,&local_498,(char (*) [6])"):\n  ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
      std::__cxx11::string::~string((string *)&local_4b8);
      cmExecutionStatus::SetError(local_20,(string *)local_438);
      args_local._7_1_ = 0;
      sizeLimit._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_438);
    }
    std::ifstream::~ifstream((void *)((long)&error.field_2 + 8));
    std::__cxx11::string::~string((string *)local_190);
    HandleReadCommand::Arguments::~Arguments((Arguments *)local_150);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleReadCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("READ must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileNameArg = args[1];
  std::string const& variable = args[2];

  struct Arguments
  {
    std::string Offset;
    std::string Limit;
    bool Hex = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("OFFSET"_s, &Arguments::Offset)
                               .Bind("LIMIT"_s, &Arguments::Limit)
                               .Bind("HEX"_s, &Arguments::Hex);

  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(3),
                                           /*unparsedArguments=*/nullptr);

  std::string fileName = fileNameArg;
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/',
                        fileNameArg);
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(fileName.c_str(),
                       arguments.Hex ? (std::ios::binary | std::ios::in)
                                     : std::ios::in);
#else
  cmsys::ifstream file(fileName.c_str());
#endif

  if (!file) {
    std::string error =
      cmStrCat("failed to open for reading (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }

  // is there a limit?
  std::string::size_type sizeLimit = std::string::npos;
  if (!arguments.Limit.empty()) {
    unsigned long long limit;
    if (cmStrToULongLong(arguments.Limit, &limit)) {
      sizeLimit = static_cast<std::string::size_type>(limit);
    }
  }

  // is there an offset?
  cmsys::ifstream::off_type offset = 0;
  if (!arguments.Offset.empty()) {
    long long off;
    if (cmStrToLongLong(arguments.Offset, &off)) {
      offset = static_cast<cmsys::ifstream::off_type>(off);
    }
  }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (arguments.Hex) {
    // Convert part of the file into hex code
    char c;
    while ((sizeLimit > 0) && (file.get(c))) {
      char hex[4];
      snprintf(hex, sizeof(hex), "%.2x", c & 0xff);
      output += hex;
      sizeLimit--;
    }
  } else {
    std::string line;
    bool has_newline = false;
    while (
      sizeLimit > 0 &&
      cmSystemTools::GetLineFromStream(file, line, &has_newline, sizeLimit)) {
      sizeLimit = sizeLimit - line.size();
      if (has_newline && sizeLimit > 0) {
        sizeLimit--;
      }
      output += line;
      if (has_newline) {
        output += "\n";
      }
    }
  }
  status.GetMakefile().AddDefinition(variable, output);
  return true;
}